

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

char * store_type_to_str(store_type stype)

{
  if (stype < 5) {
    return &DAT_001070b0 + *(int *)(&DAT_001070b0 + (ulong)stype * 4);
  }
  return (char *)0x0;
}

Assistant:

char *store_type_to_str(enum store_type stype){
    switch (stype) {
        case UNBOUNDED_MAPSTORE:
            return "UNBOUNDED MAPSTORE";
        case COLLAPSINGHIGH_MAPSTORE:
            return "HIGH COLLAPSING MAPSTORE";
        case COLLAPSINGLOW_MAPSTORE:
            return "LOW COLLAPSING MAPSTORE";
        case COLLAPSINGALL_MAPSTORE:
            return "UNIFORM COLLAPSING MAPSTORE";
        case UNIFORM_WITH_INITIAL_ALPHA:
            return "UNIFORM COLLAPSING WITH INITIAL ALPHA";
        default:
            return NULL;
    }
}